

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O2

void __thiscall
bloaty::macho::MaybeAddOverhead(macho *this,RangeSink *sink,char *label,string_view data)

{
  size_t sVar1;
  string_view name;
  string_view file_range;
  
  if (this != (macho *)0x0) {
    sVar1 = strlen((char *)sink);
    name._M_str = (char *)sink;
    name._M_len = sVar1;
    file_range._M_str = (char *)data._M_len;
    file_range._M_len = (size_t)label;
    RangeSink::AddFileRange((RangeSink *)this,"macho_overhead",name,file_range);
    return;
  }
  return;
}

Assistant:

void MaybeAddOverhead(RangeSink* sink, const char* label, string_view data) {
  if (sink) {
    sink->AddFileRange("macho_overhead", label, data);
  }
}